

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtspd.c
# Opt level: O3

int main(int argc,char **argv)

{
  __pid_t _Var1;
  byte bVar2;
  unsigned_short uVar3;
  int iVar4;
  __pid_t _Var5;
  int iVar6;
  int iVar7;
  int *piVar8;
  char *pcVar9;
  uint *puVar10;
  ssize_t sVar11;
  byte *__s2;
  size_t sVar12;
  size_t sVar13;
  char *pcVar14;
  size_t sVar15;
  ssize_t sVar16;
  FILE *pFVar17;
  char *pcVar18;
  ulong uVar19;
  ulong uVar20;
  socklen_t __len;
  size_t __n;
  uint uVar21;
  uint uVar22;
  char *pcVar23;
  long lVar24;
  bool bVar25;
  char *cmd;
  int prot_minor;
  byte bStack_24c59;
  size_t count;
  int num;
  size_t cmdsize;
  int rtp_size;
  int rtp_channel;
  int prot_major;
  int flag;
  int rtp_partno;
  char *pcStack_24c28;
  char *pcStack_24c20;
  int iStack_24c18;
  __pid_t _Stack_24c14;
  char *pcStack_24c10;
  char *pcStack_24c08;
  char *pcStack_24c00;
  char *endptr;
  undefined8 uStack_24bf0;
  undefined8 uStack_24be8;
  undefined8 uStack_24be0;
  undefined8 uStack_24bd8;
  undefined8 uStack_24bd0;
  undefined8 uStack_24bc8;
  undefined8 uStack_24bc0;
  undefined8 uStack_24bb8;
  undefined8 uStack_24bb0;
  sockaddr sStack_24af0;
  undefined4 uStack_24ae0;
  undefined4 uStack_24adc;
  undefined4 uStack_24ad8;
  undefined1 auStack_24a84 [4];
  httprequest req;
  
  memset(&req,0,0x24a50);
  if (argc < 2) {
    pcStack_24c20 = ".rtsp.pid";
    uVar3 = 8999;
  }
  else {
    uVar3 = 8999;
    pcStack_24c20 = ".rtsp.pid";
    iVar6 = 1;
    do {
      pcVar9 = argv[iVar6];
      iVar4 = strcmp("--version",pcVar9);
      if (iVar4 == 0) {
        curl_mprintf("rtspd IPv4%s\n","/IPv6");
        return 0;
      }
      iVar4 = strcmp("--pidfile",pcVar9);
      if (iVar4 == 0) {
        iVar4 = iVar6 + 1;
        if (iVar4 < argc) {
          pcStack_24c20 = argv[iVar4];
          iVar4 = iVar6 + 2;
        }
      }
      else {
        iVar4 = strcmp("--logfile",pcVar9);
        if (iVar4 == 0) {
          iVar4 = iVar6 + 1;
          if (iVar4 < argc) {
            serverlogfile = argv[iVar4];
            iVar4 = iVar6 + 2;
          }
        }
        else {
          iVar4 = strcmp("--ipv4",pcVar9);
          if (iVar4 == 0) {
            ipv_inuse = "IPv4";
            use_ipv6 = 0;
          }
          else {
            iVar4 = strcmp("--ipv6",pcVar9);
            if (iVar4 != 0) {
              iVar4 = strcmp("--port",pcVar9);
              if (iVar4 == 0) {
                iVar4 = iVar6 + 1;
                if (iVar4 < argc) {
                  uVar19 = strtoul(argv[iVar4],&endptr,10);
                  pcStack_24c28 = endptr;
                  pcVar9 = argv[iVar4];
                  sVar12 = strlen(pcVar9);
                  if ((pcStack_24c28 != pcVar9 + sVar12) || (0xfbfe < uVar19 - 0x401)) {
                    curl_mfprintf(_stderr,"rtspd: invalid --port argument (%s)\n",pcVar9);
                    return 0;
                  }
                  uVar3 = curlx_ultous(uVar19);
LAB_00105096:
                  iVar4 = iVar6 + 2;
                }
              }
              else {
                iVar4 = strcmp("--srcdir",pcVar9);
                if (iVar4 != 0) {
                  puts(
                      "Usage: rtspd [option]\n --version\n --logfile [file]\n --pidfile [file]\n --ipv4\n --ipv6\n --port [port]\n --srcdir [path]"
                      );
                  return 0;
                }
                iVar4 = iVar6 + 1;
                if (iVar4 < argc) {
                  path = argv[iVar4];
                  goto LAB_00105096;
                }
              }
              goto LAB_0010509d;
            }
            ipv_inuse = "IPv6";
            use_ipv6 = 1;
          }
          iVar4 = iVar6 + 1;
        }
      }
LAB_0010509d:
      iVar6 = iVar4;
    } while (iVar6 < argc);
  }
  old_sighup_handler = (SIGHANDLER_T)signal(1,(__sighandler_t)0x1);
  if (old_sighup_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    logmsg("cannot install SIGHUP handler: %s",pcVar9);
  }
  old_sigpipe_handler = (SIGHANDLER_T)signal(0xd,(__sighandler_t)0x1);
  if (old_sigpipe_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    logmsg("cannot install SIGPIPE handler: %s",pcVar9);
  }
  old_sigalrm_handler = (SIGHANDLER_T)signal(0xe,(__sighandler_t)0x1);
  if (old_sigalrm_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    logmsg("cannot install SIGALRM handler: %s",pcVar9);
  }
  old_sigint_handler = (SIGHANDLER_T)signal(2,exit_signal_handler);
  if (old_sigint_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    logmsg("cannot install SIGINT handler: %s",pcVar9);
  }
  else {
    siginterrupt(2,1);
  }
  old_sigterm_handler = (SIGHANDLER_T)signal(0xf,exit_signal_handler);
  if (old_sigterm_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    logmsg("cannot install SIGTERM handler: %s",pcVar9);
  }
  else {
    siginterrupt(0xf,1);
  }
  _Var5 = getpid();
  iVar6 = socket((uint)use_ipv6 * 8 + 2,1,0);
  if (iVar6 == -1) {
    puVar10 = (uint *)__errno_location();
    uVar21 = *puVar10;
    pcVar9 = strerror(uVar21);
    logmsg("Error creating socket: (%d) %s",(ulong)uVar21,pcVar9);
    bVar25 = true;
    goto LAB_00105385;
  }
  flag = 1;
  iVar4 = setsockopt(iVar6,1,2,&flag,4);
  if (iVar4 == 0) {
    sStack_24af0.sa_data._0_2_ = uVar3 << 8 | uVar3 >> 8;
    if (use_ipv6 == 0) {
      sStack_24af0.sa_data[6] = '\0';
      sStack_24af0.sa_data[7] = '\0';
      sStack_24af0.sa_data[8] = '\0';
      sStack_24af0.sa_data[9] = '\0';
      sStack_24af0.sa_data[10] = '\0';
      sStack_24af0.sa_data[0xb] = '\0';
      sStack_24af0.sa_data[0xc] = '\0';
      sStack_24af0.sa_data[0xd] = '\0';
      sStack_24af0.sa_family = 2;
      __len = 0x10;
    }
    else {
      uStack_24ad8 = 0;
      sStack_24af0.sa_family = 10;
      sStack_24af0.sa_data._6_4_ = SUB84(_in6addr_any,0);
      sStack_24af0.sa_data._10_4_ = SUB84((ulong)_in6addr_any >> 0x20,0);
      uStack_24ae0 = (undefined4)_poll;
      uStack_24adc = (undefined4)((ulong)_poll >> 0x20);
      __len = 0x1c;
    }
    sStack_24af0.sa_data[2] = '\0';
    sStack_24af0.sa_data[3] = '\0';
    sStack_24af0.sa_data[4] = '\0';
    sStack_24af0.sa_data[5] = '\0';
    iVar4 = bind(iVar6,&sStack_24af0,__len);
    if (iVar4 == 0) {
      logmsg("Running %s version on port %d",ipv_inuse,(ulong)uVar3);
      iVar4 = listen(iVar6,5);
      if (iVar4 != 0) {
        puVar10 = (uint *)__errno_location();
        uVar21 = *puVar10;
        pcVar9 = strerror(uVar21);
        pcVar23 = "listen() failed with error: (%d) %s";
        goto LAB_00105270;
      }
      iVar7 = write_pidfile(pcStack_24c20);
      iVar4 = iVar6;
      _Var1 = _Var5;
      if (iVar7 != 0) {
        do {
          _Stack_24c14 = _Var1;
          iStack_24c18 = iVar4;
          iVar4 = accept(iVar6,(sockaddr *)0x0,(socklen_t *)0x0);
          if (got_exit_signal != 0) {
LAB_00106df7:
            if (iVar4 != -1 && iVar4 != iVar6) {
              close(iVar4);
            }
            bVar25 = false;
            break;
          }
          if (iVar4 == -1) {
            puVar10 = (uint *)__errno_location();
            uVar21 = *puVar10;
            pcVar9 = strerror(uVar21);
            bVar25 = false;
            logmsg("MAJOR ERROR: accept() failed with error: (%d) %s",(ulong)uVar21,pcVar9);
            break;
          }
          set_advisor_read_lock("log/serverlogs.lock");
          serverlogslocked = '\x01';
          logmsg("====> Client connect");
          flag = 1;
          iVar6 = setsockopt(iVar4,6,1,&flag,4);
          if (iVar6 == -1) {
            logmsg("====> TCP_NODELAY failed");
          }
          req.pipelining = false;
          do {
            if (got_exit_signal != 0) break;
            pcStack_24c00 = req.reqbuf + req.checkindex;
            pcVar9 = (char *)(req.offset - req.checkindex);
            bStack_24c59 = req.pipelining;
            bVar25 = req.pipelining == false;
            if (bVar25) {
              pcStack_24c00 = (char *)0x0;
            }
            req.checkindex = 0;
            req.offset = 0;
            req.testno = -7;
            req.partno = 0;
            req.open = true;
            req.auth_req = false;
            req.auth = false;
            req.cl = 0;
            req.digest = false;
            req.ntlm = false;
            req.prot_version = 0;
            req.pipelining = false;
            req.pipe = 0;
            req.skip = 0;
            req.rcmd = 0;
            req.protocol = RPROT_NONE;
            req.rtp_buffer = (char *)0x0;
            req.rtp_buffersize = 0;
            if (bVar25) {
              pcVar9 = (char *)0x0;
            }
            do {
              if ((pcVar9 != (char *)0x0 & bStack_24c59) == 1) {
                memmove(&req,pcStack_24c00,(size_t)pcVar9);
                sVar11 = curlx_uztosz((size_t)pcVar9);
                pcVar9 = (char *)0x0;
              }
              else {
                sVar12 = req.cl;
                if (req.skip == 0) {
                  sVar12 = 149999 - req.offset;
                }
                sVar11 = recv(iVar4,req.reqbuf + req.offset,sVar12,0);
              }
              if (got_exit_signal != 0) goto LAB_00106d73;
              if (sVar11 == 0) {
                logmsg("Connection closed by client");
LAB_00106d53:
                req.reqbuf[req.offset] = '\0';
                storerequest(req.reqbuf,req.offset);
                goto LAB_00106d73;
              }
              if (sVar11 < 0) {
                puVar10 = (uint *)__errno_location();
                uVar21 = *puVar10;
                pcVar9 = strerror(uVar21);
                logmsg("recv() returned error: (%d) %s",(ulong)uVar21,pcVar9);
                goto LAB_00106d53;
              }
              pcStack_24c28 = pcVar9;
              logmsg("Read %zd bytes",sVar11);
              req.offset = sVar11 + req.offset;
              req.reqbuf[req.offset] = '\0';
              pcVar9 = req.reqbuf + req.checkindex;
              pcVar23 = strstr(pcVar9,"\r\n\r\n");
              logmsg("ProcessRequest() called with testno %ld and line [%s]",req.testno,pcVar9);
              lVar24 = req.testno;
              if ((req.testno == -7) &&
                 (iVar6 = __isoc99_sscanf(pcVar9,"%255s %139999s %4s/%d.%d",ProcessRequest_request,
                                          &ProcessRequest_doc,&ProcessRequest_prot_str,&prot_major,
                                          &prot_minor), lVar24 = req.testno, iVar6 == 5)) {
                if (DAT_0012ea14 == '\0' && ProcessRequest_prot_str == 0x50545448) {
                  req.protocol = RPROT_HTTP;
LAB_001057c5:
                  uVar20 = _prot_major & 0xffffffff;
                  uVar19 = (ulong)(uint)prot_minor;
                  req.prot_version = prot_minor + prot_major * 10;
                  __s2 = (byte *)strrchr((char *)&ProcessRequest_doc,0x2f);
                  if (__s2 == (byte *)0x0) {
                    iVar6 = __isoc99_sscanf(&req,"CONNECT %139999s HTTP/%d.%d",&ProcessRequest_doc,
                                            &prot_major,&prot_minor);
                    if (iVar6 == 3) {
                      curl_msnprintf((char *)&endptr,0x100,
                                     "Received a CONNECT %s HTTP/%d.%d request",&ProcessRequest_doc,
                                     _prot_major & 0xffffffff,(ulong)(uint)prot_minor);
                      logmsg("%s");
                      if (req.prot_version == 10) {
                        req._150032_2_ = req._150032_2_ & 0xff00;
                      }
                      if (((ushort)((uint)ProcessRequest_doc >> 0x10) & 0xff) == 100 &&
                          (short)ProcessRequest_doc == 0x6162) {
                        req.testno = -5;
                        lVar24 = req.testno;
                      }
                      else if (ProcessRequest_doc == 0x74736574) {
                        pcVar18 = strchr((char *)&ProcessRequest_doc,0x3a);
                        lVar24 = -3;
                        if (((pcVar18 != (char *)0x0) && (pcVar18[1] != 0)) &&
                           (iVar6 = Curl_isdigit((uint)(byte)pcVar18[1]), iVar6 != 0)) {
                          lVar24 = strtol(pcVar18 + 1,(char **)0x0,10);
                        }
                      }
                      else {
                        req.testno = -3;
                        lVar24 = req.testno;
                      }
                    }
                    else {
                      logmsg("Did not find test number in PATH");
                      req.testno = -1;
                      lVar24 = req.testno;
                    }
                    goto LAB_00105f4a;
                  }
                  sVar12 = strlen((char *)&ProcessRequest_doc);
                  sVar13 = strlen(ProcessRequest_request);
                  if (sVar13 + sVar12 < 200) {
                    curl_msnprintf((char *)&endptr,0x100,"Got request: %s %s %s/%d.%d",
                                   ProcessRequest_request,&ProcessRequest_doc,
                                   &ProcessRequest_prot_str,uVar20,uVar19);
                  }
                  else {
                    curl_msnprintf((char *)&endptr,0x100,"Got a *HUGE* request %s/%d.%d",
                                   &ProcessRequest_prot_str,uVar20,uVar19);
                  }
                  logmsg("%s",&endptr);
                  iVar6 = strncmp("/verifiedserver",(char *)__s2,0xf);
                  if (iVar6 == 0) {
                    logmsg("Are-we-friendly question received");
                    req.testno = -2;
                  }
                  else {
                    iVar6 = strncmp("/quit",(char *)__s2,5);
                    if (iVar6 == 0) {
                      logmsg("Request-to-quit received");
                      req.testno = -6;
                    }
                    else {
                      do {
                        __s2 = __s2 + 1;
                        if (*__s2 == 0) break;
                        iVar6 = Curl_isdigit((uint)*__s2);
                      } while (iVar6 == 0);
                      count = (size_t)__s2;
                      req.testno = strtol((char *)__s2,(char **)&count,10);
                      if (req.testno < 0x2711) {
                        req.partno = 0;
                      }
                      else {
                        req.partno = (ulong)req.testno % 10000;
                        req.testno = (ulong)req.testno / 10000;
                      }
                      curl_msnprintf((char *)&endptr,0x100,"Requested test number %ld part %ld");
                      logmsg("%s",&endptr);
                      pcVar18 = test2file(req.testno);
                      pFVar17 = fopen64(pcVar18,"rb");
                      if (pFVar17 == (FILE *)0x0) {
                        puVar10 = (uint *)__errno_location();
                        uVar21 = *puVar10;
                        pcVar9 = strerror(uVar21);
                        logmsg("fopen() failed with error: %d %s",(ulong)uVar21,pcVar9);
                        logmsg("Error opening file: %s",pcVar18);
                        logmsg("Couldn\'t open test file %ld");
                      }
                      else {
                        cmd = (char *)0x0;
                        cmdsize = 0;
                        num = 0;
                        rtp_channel = 0;
                        rtp_size = 0;
                        rtp_partno = -1;
                        iVar6 = getpart(&cmd,&cmdsize,"reply","servercmd",(FILE *)pFVar17);
                        fclose(pFVar17);
                        pcVar18 = cmd;
                        if (iVar6 == 0) {
                          count = (size_t)cmd;
                          if (cmdsize == 0) {
                            free(cmd);
                            lVar24 = req.testno;
                          }
                          else {
                            logmsg("Found a reply-servercmd section!");
                            do {
                              iVar6 = strncmp("auth_required",pcVar18,0xd);
                              if (iVar6 == 0) {
                                logmsg("instructed to require authorization header");
                                req.auth_req = true;
                              }
                              else {
                                iVar6 = strncmp("idle",pcVar18,4);
                                if (iVar6 == 0) {
                                  logmsg("instructed to idle");
                                  req.rcmd = 1;
                                  req.open = true;
                                }
                                else {
                                  iVar6 = strncmp("stream",pcVar18,6);
                                  if (iVar6 == 0) {
                                    logmsg("instructed to stream");
                                    req.rcmd = 2;
                                  }
                                  else {
                                    iVar6 = __isoc99_sscanf(pcVar18,"pipe: %d",&num);
                                    if (iVar6 == 1) {
                                      logmsg("instructed to allow a pipe size of %d",
                                             (ulong)(uint)num);
                                      if (num < 0) {
                                        logmsg("negative pipe size ignored");
                                      }
                                      else if (num != 0) {
                                        req.pipe = num + -1;
                                      }
                                    }
                                    else {
                                      iVar6 = __isoc99_sscanf(pcVar18,"skip: %d",&num);
                                      if (iVar6 == 1) {
                                        logmsg("instructed to skip this number of bytes %d",
                                               (ulong)(uint)num);
                                        req.skip = num;
                                      }
                                      else {
                                        iVar6 = __isoc99_sscanf(pcVar18,
                                                  "rtp: part %d channel %d size %d",&rtp_partno,
                                                  &rtp_channel,&rtp_size);
                                        if (iVar6 == 3) {
                                          if (req.partno == rtp_partno) {
                                            logmsg("RTP: part %d channel %d size %d",
                                                   (long)rtp_partno,(ulong)(uint)rtp_channel,
                                                   (ulong)(uint)rtp_size);
                                            iVar6 = rtp_size;
                                            uVar19 = (ulong)rtp_size;
                                            pcVar14 = (char *)malloc(uVar19 + 0x10);
                                            *pcVar14 = '$';
                                            pcVar14[1] = (char)rtp_channel;
                                            pcVar14[2] = (char)((uint)iVar6 >> 8);
                                            pcVar14[3] = (char)iVar6;
                                            if (0 < (long)uVar19) {
                                              uVar20 = 0;
                                              do {
                                                builtin_strncpy(pcVar14 + uVar20 + 4,"$_1234\n",8);
                                                builtin_strncpy(pcVar14 + uVar20 + 0xc,"asdf",4);
                                                uVar20 = uVar20 + 0xc;
                                              } while (uVar20 < uVar19);
                                            }
                                            uVar20 = uVar19;
                                            if (req.rtp_buffer != (char *)0x0) {
                                              pcStack_24c10 = pcVar14;
                                              pcStack_24c08 =
                                                   (char *)realloc(req.rtp_buffer,
                                                                   uVar19 + req.rtp_buffersize + 4);
                                              sVar15 = req.rtp_buffersize;
                                              uVar19 = (ulong)rtp_size;
                                              memcpy(pcStack_24c08 + req.rtp_buffersize,
                                                     pcStack_24c10,uVar19 + 4);
                                              free(pcStack_24c10);
                                              pcVar14 = pcStack_24c08;
                                              uVar20 = sVar15 + uVar19;
                                            }
                                            req.rtp_buffersize = uVar20 + 4;
                                            req.rtp_buffer = pcVar14;
                                            logmsg("rtp_buffersize is %zu, rtp_size is %d.",
                                                   req.rtp_buffersize,uVar19);
                                          }
                                        }
                                        else {
                                          logmsg("funny instruction found: %s",pcVar18);
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                              pcVar14 = strchr(pcVar18,10);
                              if (pcVar14 == (char *)0x0) {
                                pcVar18 = (char *)0x0;
                                break;
                              }
                              pcVar18 = pcVar14 + 1;
                            } while (pcVar14[1] != '\0');
                            count = (size_t)pcVar18;
                            logmsg("Done parsing server commands");
                            free(cmd);
                            lVar24 = req.testno;
                          }
                          goto LAB_00105f4a;
                        }
                        logmsg("getpart() failed with error: %d");
                      }
                      req._150032_2_ = req._150032_2_ & 0xff00;
                    }
                  }
                }
                else {
                  if (DAT_0012ea14 == '\0' && ProcessRequest_prot_str == 0x50535452) {
                    req.protocol = RPROT_RTSP;
                    goto LAB_001057c5;
                  }
                  req.protocol = RPROT_NONE;
                  logmsg("got unknown protocol %s");
                }
                bVar25 = true;
LAB_001061aa:
                pcVar9 = pcStack_24c28;
                if (got_exit_signal != 0) goto LAB_00106d73;
                if (bVar25) {
                  if (req.pipe == 0) break;
                  logmsg("Waiting for another piped request");
                  req.pipe = req.pipe + -1;
                }
              }
              else {
LAB_00105f4a:
                req.testno = lVar24;
                if (pcVar23 != (char *)0x0) {
                  logmsg("ProcessRequest found a complete request");
                  if (req.pipe != 0) {
                    req.checkindex = (size_t)(pcVar23 + (req.checkindex - (long)pcVar9) + 4);
                  }
LAB_00105f88:
                  bVar25 = true;
                  if (got_exit_signal != 0) goto LAB_001061aa;
                  if ((req.cl != 0) ||
                     (iVar6 = Curl_strncasecompare("Content-Length:",pcVar9,0xf), iVar6 == 0)) {
                    iVar6 = Curl_strncasecompare("Transfer-Encoding: chunked",pcVar9,0x1a);
                    if (iVar6 == 0) goto code_r0x00105fd6;
                    pcVar9 = strstr(req.reqbuf,"\r\n0\r\n\r\n");
                    bVar25 = pcVar9 != (char *)0x0;
                    goto LAB_001061aa;
                  }
                  bVar2 = pcVar9[0xf];
                  pcVar9 = pcVar9 + 0xf;
                  while ((bVar2 != 0 && (iVar6 = Curl_isspace((uint)bVar2), iVar6 != 0))) {
                    bVar2 = pcVar9[1];
                    pcVar9 = pcVar9 + 1;
                  }
                  endptr = pcVar9;
                  piVar8 = __errno_location();
                  *piVar8 = 0;
                  uVar19 = strtoul(pcVar9,&endptr,10);
                  if (((pcVar9 != endptr) && (iVar6 = Curl_isspace((uint)(byte)*endptr), iVar6 != 0)
                      ) && (*piVar8 != 0x22)) {
                    req.cl = uVar19 - (long)req.skip;
                    logmsg("Found Content-Length: %lu in the request",uVar19);
                    if (req.skip != 0) {
                      logmsg("... but will abort after %zu bytes",req.cl);
                    }
LAB_00105fec:
                    if ((req.auth == false) &&
                       (pcVar9 = strstr(req.reqbuf,"Authorization:"), pcVar9 != (char *)0x0)) {
                      req.auth = true;
                      if (req.auth_req == true) {
                        logmsg("Authorization header found, as required");
                      }
                    }
                    if ((req.digest == false) &&
                       (pcVar9 = strstr(req.reqbuf,"Authorization: Digest"), pcVar9 != (char *)0x0))
                    {
                      req.digest = true;
                      pcVar9 = "Received Digest request, sending back data %ld";
                      sVar15 = req.partno + 1000U;
                      req.partno = req.partno + 1000U;
                      goto LAB_00106293;
                    }
                    if (req.ntlm == false) {
                      pcVar9 = strstr(req.reqbuf,"Authorization: NTLM TlRMTVNTUAAD");
                      if (pcVar9 == (char *)0x0) {
                        pcVar9 = strstr(req.reqbuf,"Authorization: NTLM TlRMTVNTUAAB");
                        if (pcVar9 == (char *)0x0) goto LAB_001060ca;
                        sVar15 = req.partno + 0x3e9;
                        req.ntlm = true;
                        pcVar9 = "Received NTLM type-1, sending back data %ld";
                        req.partno = sVar15;
                      }
                      else {
                        req.partno = req.partno + 0x3ea;
                        req.ntlm = true;
                        logmsg("Received NTLM type-3, sending back data %ld");
                        if (req.cl == 0) goto LAB_0010629a;
                        pcVar9 = "  Expecting %zu POSTed bytes";
                        sVar15 = req.cl;
                      }
LAB_00106293:
                      logmsg(pcVar9,sVar15);
                    }
                    else {
LAB_001060ca:
                      lVar24 = req.partno;
                      if ((999 < req.partno) &&
                         (pcVar9 = strstr(req.reqbuf,"Authorization: Basic"), pcVar9 != (char *)0x0)
                         ) {
                        pcVar9 = "Received Basic request, sending back data %ld";
                        sVar15 = lVar24 + 1U;
                        req.partno = lVar24 + 1U;
                        goto LAB_00106293;
                      }
                    }
LAB_0010629a:
                    pcVar9 = strstr(req.reqbuf,"Connection: close");
                    if (pcVar9 != (char *)0x0) {
                      req._150032_2_ = req._150032_2_ & 0xff00;
                    }
                    iVar6 = req.pipe;
                    if (req.pipe == 0) {
                      if (((req.open == true) && (10 < req.prot_version)) &&
                         (pcVar23 + 4 < req.reqbuf + req.offset)) {
                        if ((req.reqbuf[2] == 'T' && (req.reqbuf[1] == 'E' && req.reqbuf[0] == 'G'))
                           || (req.reqbuf._0_4_ == 0x44414548)) {
                          req.checkindex = (size_t)(pcVar23 + (4 - (long)&req));
                          req.pipelining = true;
                        }
                      }
                    }
                    else {
                      do {
                        sVar15 = req.checkindex;
                        iVar6 = iVar6 + -1;
                        if (got_exit_signal != 0) goto LAB_001061aa;
                        pcVar9 = req.reqbuf + req.checkindex;
                        pcVar23 = strstr(pcVar9,"\r\n\r\n");
                        if (pcVar23 == (char *)0x0) {
                          pcVar23 = (char *)0x0;
                          break;
                        }
                        req.checkindex = (size_t)(pcVar23 + (sVar15 - (long)pcVar9) + 4);
                        req.pipe = iVar6;
                      } while (iVar6 != 0);
                    }
                    if (((req.auth_req != true) || (req.auth == true)) && (req.cl != 0)) {
                      bVar25 = req.cl <= auStack_24a84 + (req.offset - (long)pcVar23);
                    }
                    goto LAB_001061aa;
                  }
                  logmsg("Found invalid Content-Length: (%s) in the request");
                  req._150032_2_ = req._150032_2_ & 0xff00;
                  goto LAB_001061aa;
                }
                logmsg("ProcessRequest returned without a complete request");
                pcVar9 = pcStack_24c28;
                if (got_exit_signal != 0) goto LAB_00106d73;
              }
            } while (req.offset < 149999);
            pcVar9 = "Request would overflow buffer, closing connection";
            if (req.offset == 149999) {
LAB_00106467:
              bVar25 = false;
              logmsg(pcVar9);
              sVar15 = 149999;
            }
            else {
              bVar25 = true;
              pcVar9 = "Request buffer overflow, closing connection";
              sVar15 = req.offset;
              if (149999 < req.offset) goto LAB_00106467;
            }
            req.reqbuf[sVar15] = '\0';
            storerequest(req.reqbuf,(&req.checkindex)[req.pipelining ^ 1]);
            if ((!bVar25) || (got_exit_signal != 0)) break;
            if (prevbounce == '\x01') {
              if ((req.testno == prevtestno) && (req.partno == prevpartno)) {
                req.partno = req.partno + 1;
                logmsg("BOUNCE part number to %ld",req.partno);
              }
              else {
                prevbounce = '\0';
                prevtestno = -1;
                prevpartno = -1;
              }
            }
            cmd = (char *)0x0;
            cmdsize = 0;
            _prot_major = 0;
            logmsg("Send response number %ld part %ld",req.testno,req.partno);
            if (req.rcmd != 1) {
              if (req.rcmd == 2) {
                do {
                  sVar16 = send(iVar4,"a string to stream 01234567890\n",0x1f,0x4000);
                  if (got_exit_signal != 0) goto LAB_00106b37;
                } while (sVar16 == 0x1f);
                pcVar9 = "Stopped streaming";
LAB_00106769:
                logmsg(pcVar9);
              }
              else {
                req._150032_2_ = req._150032_2_ & 0xff00;
                if (req.testno < 0) {
                  switch(req.testno) {
                  default:
                    logmsg("Replying to with a 404");
                    pcVar9 = 
                    "RTSP/1.0 404 Not Found\r\nServer: curl test suite RTSP server/0.1\r\n\r\n";
                    if (req.protocol == RPROT_HTTP) {
                      pcVar9 = 
                      "HTTP/1.1 404 Not Found\r\nServer: curl test suite RTSP server/0.1\r\nConnection: close\r\nContent-Type: text/html\r\n\r\n<!DOCTYPE HTML PUBLIC \"-//IETF//DTD HTML 2.0//EN\">\n<HTML><HEAD>\n<TITLE>404 Not Found</TITLE>\n</HEAD><BODY>\n<H1>Not Found</H1>\nThe requested URL was not found on this server.\n<P><HR><ADDRESS>curl test suite RTSP server/0.1</ADDRESS>\n</BODY></HTML>\n"
                      ;
                    }
                    break;
                  case -6:
                    logmsg("Replying to QUIT");
                    pcVar9 = "HTTP/1.1 200 Goodbye\r\n\r\n";
                    break;
                  case -5:
                    logmsg("Replying to a bad CONNECT");
                    pcVar9 = "HTTP/1.1 501 Forbidden you fool\r\n\r\n";
                    break;
                  case -4:
                    pcVar9 = "Bailing out due to internal error";
                    goto LAB_00106769;
                  case -3:
                    logmsg("Replying to CONNECT");
                    pcVar9 = "HTTP/1.1 200 Mighty fine indeed\r\n\r\n";
                    break;
                  case -2:
                    logmsg("Identifying ourselves as friends");
                    _Var5 = getpid();
                    curl_msnprintf((char *)&endptr,0x40,"RTSP_SERVER WE ROOLZ: %ld\r\n",(long)_Var5)
                    ;
                    sVar12 = strlen((char *)&endptr);
                    curl_msnprintf(send_doc_weare,0x100,
                                   "HTTP/1.1 200 OK\r\nContent-Length: %zu\r\n\r\n%s",sVar12,&endptr
                                  );
                    pcVar9 = send_doc_weare;
                  }
                  count = strlen(pcVar9);
LAB_001067d8:
                  if (got_exit_signal == 0) {
                    pcVar23 = strstr(pcVar9,"swsclose");
                    bVar25 = count != 0;
                    if (!bVar25 || pcVar23 != (char *)0x0) {
                      logmsg("connection close instruction \"swsclose\" found in response");
                    }
                    pcVar18 = strstr(pcVar9,"swsbounce");
                    if (pcVar18 == (char *)0x0) {
                      prevbounce = '\0';
                    }
                    else {
                      prevbounce = '\x01';
                      logmsg("enable \"swsbounce\" in the next request");
                    }
                    pFVar17 = fopen64("log/server.response","ab");
                    sVar15 = count;
                    if (pFVar17 == (FILE *)0x0) {
                      puVar10 = (uint *)__errno_location();
                      uVar21 = *puVar10;
                      pcVar9 = strerror(uVar21);
                      logmsg("fopen() failed with error: %d %s",(ulong)uVar21,pcVar9);
                      logmsg("Error opening file: %s");
                      logmsg("couldn\'t create logfile: log/server.response");
                      free(cmd);
                      free((void *)cmdsize);
                    }
                    else {
                      do {
                        __n = count;
                        if (199 < count) {
                          __n = 200;
                        }
                        uVar19 = send(iVar4,pcVar9,__n,0x4000);
                        if ((long)uVar19 < 0) break;
                        logmsg("Sent off %zd bytes",uVar19);
                        fwrite(pcVar9,1,uVar19,pFVar17);
                        if (got_exit_signal != 0) break;
                        pcVar9 = pcVar9 + uVar19;
                        count = count - uVar19;
                      } while (count != 0);
                      uVar19 = uVar19 >> 0x3f;
                      if (req.rtp_buffer != (char *)0x0) {
                        logmsg("About to write %zu RTP bytes",req.rtp_buffersize);
                        count = req.rtp_buffersize;
                        do {
                          sVar12 = 200;
                          if (count < 200) {
                            sVar12 = count;
                          }
                          sVar16 = send(iVar4,req.rtp_buffer + (req.rtp_buffersize - count),sVar12,
                                        0x4000);
                          if (sVar16 < 0) {
                            uVar19 = 1;
                            break;
                          }
                          count = count - sVar16;
                        } while (count != 0);
                        free(req.rtp_buffer);
                        req.rtp_buffersize = 0;
                      }
                      do {
                        iVar6 = fclose(pFVar17);
                        if (iVar6 == 0) goto LAB_00106a72;
                        puVar10 = (uint *)__errno_location();
                        uVar21 = *puVar10;
                      } while (uVar21 == 4);
                      pcVar9 = strerror(uVar21);
                      logmsg("Error closing file %s error: %d %s","log/server.response",
                             (ulong)uVar21,pcVar9);
LAB_00106a72:
                      if (got_exit_signal == 0) {
                        if ((char)uVar19 == '\0') {
                          logmsg("Response sent (%zu bytes) and written to log/server.response");
                          free(cmd);
                          if (_prot_major != 0) {
                            cmd = (char *)cmdsize;
                            do {
                              iVar6 = __isoc99_sscanf(cmd,"%31s %d",&endptr,&prot_minor);
                              if (iVar6 == 2) {
                                if (endptr._4_1_ == '\0' && (int)endptr == 0x74696177) {
                                  logmsg("Told to sleep for %d seconds",(ulong)(uint)prot_minor);
                                  uVar22 = prot_minor << 2;
                                  uVar21 = (int)uVar22 >> 0x1f & uVar22;
                                  do {
                                    if ((int)uVar22 < 1) goto LAB_00106c93;
                                    iVar6 = wait_ms(0xfa);
                                    if (got_exit_signal != 0) {
                                      uVar21 = uVar22 - 1;
                                      goto LAB_00106c93;
                                    }
                                    uVar22 = uVar22 - 1;
                                  } while (iVar6 == 0);
                                  puVar10 = (uint *)__errno_location();
                                  uVar21 = *puVar10;
                                  pcVar9 = strerror(uVar21);
                                  logmsg("wait_ms() failed with error: (%d) %s",(ulong)uVar21,pcVar9
                                        );
                                  uVar21 = uVar22;
LAB_00106c93:
                                  if (uVar21 == 0) {
                                    logmsg("Continuing after sleeping %d seconds",
                                           (ulong)(uint)prot_minor);
                                  }
                                }
                                else {
                                  logmsg("Unknown command in reply command section");
                                }
                              }
                              cmd = strchr(cmd,10);
                              pcVar9 = cmd + 1;
                            } while ((cmd != (char *)0x0) && (cmd = pcVar9, *pcVar9 != '\0'));
                          }
                          free((void *)cmdsize);
                          req.open = bVar25 && pcVar23 == (char *)0x0;
                          prevtestno = req.testno;
                          prevpartno = req.partno;
                        }
                        else {
                          logmsg("Sending response failed. Only (%zu bytes) of (%zu bytes) were sent"
                                 ,sVar15 - count,sVar15);
                          free(cmd);
                          free((void *)cmdsize);
                        }
                      }
                      else {
                        free(cmd);
                        free((void *)cmdsize);
                      }
                    }
                  }
                  else {
                    free(cmd);
                    pcVar9 = (char *)cmdsize;
LAB_001067f0:
                    free(pcVar9);
                  }
                }
                else {
                  pcVar23 = test2file(req.testno);
                  uStack_24bf0 = 0;
                  uStack_24bb8 = 0;
                  uStack_24bb0 = 0;
                  uStack_24bc8 = 0;
                  uStack_24bc0 = 0;
                  uStack_24bd8 = 0;
                  uStack_24bd0 = 0;
                  uStack_24be8 = 0;
                  uStack_24be0 = 0;
                  endptr = (char *)0x61746164;
                  if (req.partno != 0) {
                    curl_msnprintf((char *)&endptr,0x50,"data%ld");
                  }
                  pFVar17 = fopen64(pcVar23,"rb");
                  if (pFVar17 == (FILE *)0x0) {
                    puVar10 = (uint *)__errno_location();
                    uVar21 = *puVar10;
                    pcVar9 = strerror(uVar21);
                    logmsg("fopen() failed with error: %d %s",(ulong)uVar21,pcVar9);
                    logmsg("Error opening file: %s");
                    pcVar9 = "Couldn\'t open test file";
                    goto LAB_00106769;
                  }
                  iVar6 = getpart(&cmd,&count,"reply",(char *)&endptr,(FILE *)pFVar17);
                  fclose(pFVar17);
                  pcVar9 = cmd;
                  if (iVar6 != 0) {
                    logmsg("getpart() failed with error: %d");
                    goto LAB_00106b37;
                  }
                  if (got_exit_signal != 0) goto LAB_001067f0;
                  pFVar17 = fopen64(pcVar23,"rb");
                  if (pFVar17 == (FILE *)0x0) {
                    puVar10 = (uint *)__errno_location();
                    uVar21 = *puVar10;
                    pcVar9 = strerror(uVar21);
                    logmsg("fopen() failed with error: %d %s",(ulong)uVar21,pcVar9);
                    logmsg("Error opening file: %s");
                    logmsg("Couldn\'t open test file");
                  }
                  else {
                    iVar6 = getpart((char **)&cmdsize,(size_t *)&prot_major,"reply","postcmd",
                                    (FILE *)pFVar17);
                    fclose(pFVar17);
                    if (iVar6 == 0) goto LAB_001067d8;
                    logmsg("getpart() failed with error: %d");
                  }
                  free(cmd);
                }
              }
            }
LAB_00106b37:
            if (got_exit_signal != 0) break;
            if (req.testno != -3 && req.testno < 0) {
              pcVar9 = "special request received, no persistency";
LAB_00106ddd:
              logmsg(pcVar9);
              break;
            }
            if (req.open == false) {
              pcVar9 = "instructed to close connection after server-reply";
              goto LAB_00106ddd;
            }
            logmsg("=> persistent connection request ended, awaits new request");
          } while ((req.open != false) || (req.testno == -3));
LAB_00106d73:
          _Var5 = _Stack_24c14;
          iVar6 = iStack_24c18;
          if (got_exit_signal != 0) goto LAB_00106df7;
          logmsg("====> Client disconnect");
          close(iVar4);
          if (serverlogslocked == '\x01') {
            serverlogslocked = '\0';
            clear_advisor_read_lock("log/serverlogs.lock");
          }
          bVar25 = false;
          iVar4 = iStack_24c18;
          _Var1 = _Stack_24c14;
        } while (req.testno != -6);
        goto LAB_0010537e;
      }
      goto LAB_0010527a;
    }
    puVar10 = (uint *)__errno_location();
    uVar21 = *puVar10;
    pcVar9 = strerror(uVar21);
    logmsg("Error binding socket on port %hu: (%d) %s",(ulong)uVar3,(ulong)uVar21,pcVar9);
    bVar25 = true;
  }
  else {
    puVar10 = (uint *)__errno_location();
    uVar21 = *puVar10;
    pcVar9 = strerror(uVar21);
    pcVar23 = "setsockopt(SO_REUSEADDR) failed with error: (%d) %s";
LAB_00105270:
    logmsg(pcVar23,(ulong)uVar21,pcVar9);
LAB_0010527a:
    bVar25 = true;
  }
LAB_0010537e:
  close(iVar6);
LAB_00105385:
  if (got_exit_signal != 0) {
    logmsg("signalled to die");
  }
  if (!bVar25) {
    unlink(pcStack_24c20);
  }
  if (serverlogslocked == '\x01') {
    serverlogslocked = '\0';
    clear_advisor_read_lock("log/serverlogs.lock");
  }
  if (old_sighup_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(1,(__sighandler_t)old_sighup_handler);
  }
  if (old_sigpipe_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(0xd,(__sighandler_t)old_sigpipe_handler);
  }
  if (old_sigalrm_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(0xe,(__sighandler_t)old_sigalrm_handler);
  }
  if (old_sigint_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(2,(__sighandler_t)old_sigint_handler);
  }
  if (old_sigterm_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(0xf,(__sighandler_t)old_sigterm_handler);
  }
  if (got_exit_signal != 0) {
    logmsg("========> %s rtspd (port: %d pid: %ld) exits with signal (%d)",ipv_inuse,(ulong)uVar3,
           (long)_Var5,(ulong)(uint)exit_signal);
    raise(exit_signal);
  }
  logmsg("========> rtspd quits");
  return 0;
code_r0x00105fd6:
  pcVar18 = strchr(pcVar9,10);
  pcVar9 = pcVar18 + 1;
  if (pcVar18 == (char *)0x0) goto LAB_00105fec;
  goto LAB_00105f88;
}

Assistant:

int main(int argc, char *argv[])
{
  srvr_sockaddr_union_t me;
  curl_socket_t sock = CURL_SOCKET_BAD;
  curl_socket_t msgsock = CURL_SOCKET_BAD;
  int wrotepidfile = 0;
  int flag;
  unsigned short port = DEFAULT_PORT;
  const char *pidname = ".rtsp.pid";
  struct httprequest req;
  int rc;
  int error;
  int arg = 1;
  long pid;

  memset(&req, 0, sizeof(req));

  while(argc>arg) {
    if(!strcmp("--version", argv[arg])) {
      printf("rtspd IPv4%s"
             "\n"
             ,
#ifdef ENABLE_IPV6
             "/IPv6"
#else
             ""
#endif
             );
      return 0;
    }
    else if(!strcmp("--pidfile", argv[arg])) {
      arg++;
      if(argc>arg)
        pidname = argv[arg++];
    }
    else if(!strcmp("--logfile", argv[arg])) {
      arg++;
      if(argc>arg)
        serverlogfile = argv[arg++];
    }
    else if(!strcmp("--ipv4", argv[arg])) {
#ifdef ENABLE_IPV6
      ipv_inuse = "IPv4";
      use_ipv6 = FALSE;
#endif
      arg++;
    }
    else if(!strcmp("--ipv6", argv[arg])) {
#ifdef ENABLE_IPV6
      ipv_inuse = "IPv6";
      use_ipv6 = TRUE;
#endif
      arg++;
    }
    else if(!strcmp("--port", argv[arg])) {
      arg++;
      if(argc>arg) {
        char *endptr;
        unsigned long ulnum = strtoul(argv[arg], &endptr, 10);
        if((endptr != argv[arg] + strlen(argv[arg])) ||
           (ulnum < 1025UL) || (ulnum > 65535UL)) {
          fprintf(stderr, "rtspd: invalid --port argument (%s)\n",
                  argv[arg]);
          return 0;
        }
        port = curlx_ultous(ulnum);
        arg++;
      }
    }
    else if(!strcmp("--srcdir", argv[arg])) {
      arg++;
      if(argc>arg) {
        path = argv[arg];
        arg++;
      }
    }
    else {
      puts("Usage: rtspd [option]\n"
           " --version\n"
           " --logfile [file]\n"
           " --pidfile [file]\n"
           " --ipv4\n"
           " --ipv6\n"
           " --port [port]\n"
           " --srcdir [path]");
      return 0;
    }
  }

#ifdef WIN32
  win32_init();
  atexit(win32_cleanup);
#endif

  install_signal_handlers();

  pid = (long)getpid();

#ifdef ENABLE_IPV6
  if(!use_ipv6)
#endif
    sock = socket(AF_INET, SOCK_STREAM, 0);
#ifdef ENABLE_IPV6
  else
    sock = socket(AF_INET6, SOCK_STREAM, 0);
#endif

  if(CURL_SOCKET_BAD == sock) {
    error = SOCKERRNO;
    logmsg("Error creating socket: (%d) %s",
           error, strerror(error));
    goto server_cleanup;
  }

  flag = 1;
  if(0 != setsockopt(sock, SOL_SOCKET, SO_REUSEADDR,
            (void *)&flag, sizeof(flag))) {
    error = SOCKERRNO;
    logmsg("setsockopt(SO_REUSEADDR) failed with error: (%d) %s",
           error, strerror(error));
    goto server_cleanup;
  }

#ifdef ENABLE_IPV6
  if(!use_ipv6) {
#endif
    memset(&me.sa4, 0, sizeof(me.sa4));
    me.sa4.sin_family = AF_INET;
    me.sa4.sin_addr.s_addr = INADDR_ANY;
    me.sa4.sin_port = htons(port);
    rc = bind(sock, &me.sa, sizeof(me.sa4));
#ifdef ENABLE_IPV6
  }
  else {
    memset(&me.sa6, 0, sizeof(me.sa6));
    me.sa6.sin6_family = AF_INET6;
    me.sa6.sin6_addr = in6addr_any;
    me.sa6.sin6_port = htons(port);
    rc = bind(sock, &me.sa, sizeof(me.sa6));
  }
#endif /* ENABLE_IPV6 */
  if(0 != rc) {
    error = SOCKERRNO;
    logmsg("Error binding socket on port %hu: (%d) %s",
           port, error, strerror(error));
    goto server_cleanup;
  }

  logmsg("Running %s version on port %d", ipv_inuse, (int)port);

  /* start accepting connections */
  rc = listen(sock, 5);
  if(0 != rc) {
    error = SOCKERRNO;
    logmsg("listen() failed with error: (%d) %s",
           error, strerror(error));
    goto server_cleanup;
  }

  /*
  ** As soon as this server writes its pid file the test harness will
  ** attempt to connect to this server and initiate its verification.
  */

  wrotepidfile = write_pidfile(pidname);
  if(!wrotepidfile)
    goto server_cleanup;

  for(;;) {
    msgsock = accept(sock, NULL, NULL);

    if(got_exit_signal)
      break;
    if(CURL_SOCKET_BAD == msgsock) {
      error = SOCKERRNO;
      logmsg("MAJOR ERROR: accept() failed with error: (%d) %s",
             error, strerror(error));
      break;
    }

    /*
    ** As soon as this server acepts a connection from the test harness it
    ** must set the server logs advisor read lock to indicate that server
    ** logs should not be read until this lock is removed by this server.
    */

    set_advisor_read_lock(SERVERLOGS_LOCK);
    serverlogslocked = 1;

    logmsg("====> Client connect");

#ifdef TCP_NODELAY
    /*
     * Disable the Nagle algorithm to make it easier to send out a large
     * response in many small segments to torture the clients more.
     */
    flag = 1;
    if(setsockopt(msgsock, IPPROTO_TCP, TCP_NODELAY,
                   (void *)&flag, sizeof(flag)) == -1) {
      logmsg("====> TCP_NODELAY failed");
    }
#endif

    /* initialization of httprequest struct is done in get_request(), but due
       to pipelining treatment the pipelining struct field must be initialized
       previously to FALSE every time a new connection arrives. */

    req.pipelining = FALSE;

    do {
      if(got_exit_signal)
        break;

      if(get_request(msgsock, &req))
        /* non-zero means error, break out of loop */
        break;

      if(prevbounce) {
        /* bounce treatment requested */
        if((req.testno == prevtestno) &&
           (req.partno == prevpartno)) {
          req.partno++;
          logmsg("BOUNCE part number to %ld", req.partno);
        }
        else {
          prevbounce = FALSE;
          prevtestno = -1;
          prevpartno = -1;
        }
      }

      send_doc(msgsock, &req);
      if(got_exit_signal)
        break;

      if((req.testno < 0) && (req.testno != DOCNUMBER_CONNECT)) {
        logmsg("special request received, no persistency");
        break;
      }
      if(!req.open) {
        logmsg("instructed to close connection after server-reply");
        break;
      }

      if(req.open)
        logmsg("=> persistent connection request ended, awaits new request");
      /* if we got a CONNECT, loop and get another request as well! */
    } while(req.open || (req.testno == DOCNUMBER_CONNECT));

    if(got_exit_signal)
      break;

    logmsg("====> Client disconnect");
    sclose(msgsock);
    msgsock = CURL_SOCKET_BAD;

    if(serverlogslocked) {
      serverlogslocked = 0;
      clear_advisor_read_lock(SERVERLOGS_LOCK);
    }

    if(req.testno == DOCNUMBER_QUIT)
      break;
  }

server_cleanup:

  if((msgsock != sock) && (msgsock != CURL_SOCKET_BAD))
    sclose(msgsock);

  if(sock != CURL_SOCKET_BAD)
    sclose(sock);

  if(got_exit_signal)
    logmsg("signalled to die");

  if(wrotepidfile)
    unlink(pidname);

  if(serverlogslocked) {
    serverlogslocked = 0;
    clear_advisor_read_lock(SERVERLOGS_LOCK);
  }

  restore_signal_handlers();

  if(got_exit_signal) {
    logmsg("========> %s rtspd (port: %d pid: %ld) exits with signal (%d)",
           ipv_inuse, (int)port, pid, exit_signal);
    /*
     * To properly set the return status of the process we
     * must raise the same signal SIGINT or SIGTERM that we
     * caught and let the old handler take care of it.
     */
    raise(exit_signal);
  }

  logmsg("========> rtspd quits");
  return 0;
}